

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  string *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  TestPartResult *pTVar2;
  ostream *poVar3;
  int line;
  TimeInMillis ms;
  int i;
  pointer pcVar4;
  char *pcVar5;
  internal *this;
  undefined1 local_f0 [8];
  string kTestcase;
  string detail;
  undefined1 local_88 [8];
  string summary;
  string location;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f0,"testcase",(allocator<char> *)(summary.field_2._M_local_buf + 8));
  if (test_info->is_in_another_shard_ != false) goto LAB_00162168;
  std::operator<<(stream,"    <testcase");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(summary.field_2._M_local_buf + 8),"name",
             (allocator<char> *)(kTestcase.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,(test_info->name_)._M_dataplus._M_p,
             (allocator<char> *)(detail.field_2._M_local_buf + 8));
  OutputXmlAttribute(stream,(string *)local_f0,(string *)((long)&summary.field_2 + 8),
                     (string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)(summary.field_2._M_local_buf + 8));
  pbVar1 = (test_info->value_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(summary.field_2._M_local_buf + 8),"value_param",
               (allocator<char> *)(kTestcase.field_2._M_local_buf + 8));
    pbVar1 = (test_info->value_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,pcVar4,(allocator<char> *)(detail.field_2._M_local_buf + 8));
    OutputXmlAttribute(stream,(string *)local_f0,(string *)((long)&summary.field_2 + 8),
                       (string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)(summary.field_2._M_local_buf + 8));
  }
  pbVar1 = (test_info->type_param_).ptr_;
  if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(summary.field_2._M_local_buf + 8),"type_param",
               (allocator<char> *)(kTestcase.field_2._M_local_buf + 8));
    pbVar1 = (test_info->type_param_).ptr_;
    if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (pbVar1->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,pcVar4,(allocator<char> *)(detail.field_2._M_local_buf + 8));
    OutputXmlAttribute(stream,(string *)local_f0,(string *)((long)&summary.field_2 + 8),
                       (string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)(summary.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(summary.field_2._M_local_buf + 8),"status",
             (allocator<char> *)(kTestcase.field_2._M_local_buf + 8));
  pcVar5 = "notrun";
  if (test_info->should_run_ != false) {
    pcVar5 = "run";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,pcVar5,(allocator<char> *)(detail.field_2._M_local_buf + 8));
  OutputXmlAttribute(stream,(string *)local_f0,(string *)((long)&summary.field_2 + 8),
                     (string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)(summary.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(summary.field_2._M_local_buf + 8),"time",
             (allocator<char> *)(kTestcase.field_2._M_local_buf + 8));
  FormatTimeInMillisAsSeconds_abi_cxx11_
            ((string *)local_88,(internal *)(test_info->result_).elapsed_time_,ms);
  OutputXmlAttribute(stream,(string *)local_f0,(string *)((long)&summary.field_2 + 8),
                     (string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)(summary.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(summary.field_2._M_local_buf + 8),"classname",
             (allocator<char> *)(kTestcase.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,test_case_name,(allocator<char> *)(detail.field_2._M_local_buf + 8))
  ;
  OutputXmlAttribute(stream,(string *)local_f0,(string *)((long)&summary.field_2 + 8),
                     (string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)(summary.field_2._M_local_buf + 8));
  location.field_2._12_4_ = 0;
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (&kTestcase.field_2._M_allocated_capacity + 1);
  str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (&detail.field_2._M_allocated_capacity + 1);
  i = 0;
  while( true ) {
    line = 0x70;
    if ((int)(((long)(test_info->result_).test_part_results_.
                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(test_info->result_).test_part_results_.
                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= i) break;
    pTVar2 = TestResult::GetTestPartResult(&test_info->result_,i);
    if (pTVar2->type_ != kSuccess) {
      if (location.field_2._12_4_ == 0) {
        std::operator<<(stream,">\n");
      }
      this = (internal *)(pTVar2->file_name_)._M_string_length;
      if (this != (internal *)0x0) {
        this = (internal *)(pTVar2->file_name_)._M_dataplus._M_p;
      }
      __return_storage_ptr__ = (string *)((long)&summary.field_2 + 8);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (__return_storage_ptr__,this,(char *)(ulong)(uint)pTVar2->line_number_,line);
      std::operator+(pbVar1,__return_storage_ptr__,"\n");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     pbVar1,(pTVar2->summary_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)pbVar1);
      poVar3 = std::operator<<(stream,"      <failure message=\"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)str,(char *)local_88,
                 (allocator<char> *)(location.field_2._M_local_buf + 0xb));
      EscapeXmlAttribute(pbVar1,str);
      poVar3 = std::operator<<(poVar3,(string *)pbVar1);
      std::operator<<(poVar3,"\" type=\"\">");
      std::__cxx11::string::~string((string *)pbVar1);
      std::__cxx11::string::~string((string *)str);
      std::operator+(str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&summary.field_2 + 8),"\n");
      std::operator+(pbVar1,str,(pTVar2->message_)._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)str);
      RemoveInvalidXmlCharacters(str,pbVar1);
      OutputXmlCDataSection(stream,(char *)detail.field_2._8_8_);
      std::__cxx11::string::~string((string *)str);
      std::operator<<(stream,"</failure>\n");
      location.field_2._12_4_ = location.field_2._12_4_ + 1;
      std::__cxx11::string::~string((string *)pbVar1);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)(summary.field_2._M_local_buf + 8));
    }
    i = i + 1;
  }
  if (location.field_2._12_4_ == 0) {
    if ((int)((ulong)((long)(test_info->result_).test_properties_.
                            super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(test_info->result_).test_properties_.
                           super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6) != 0) {
      std::operator<<(stream,">\n");
      goto LAB_0016214a;
    }
    pcVar5 = " />\n";
  }
  else {
LAB_0016214a:
    OutputXmlTestProperties(stream,&test_info->result_);
    pcVar5 = "    </testcase>\n";
  }
  std::operator<<(stream,pcVar5);
LAB_00162168:
  std::__cxx11::string::~string((string *)local_f0);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestcase, "name", test_info.name());

  if (test_info.value_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "type_param", test_info.type_param());
  }

  OutputXmlAttribute(stream, kTestcase, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestcase, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(stream, kTestcase, "classname", test_case_name);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}